

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmELF.cxx
# Opt level: O3

bool __thiscall
cmELFInternalImpl<cmELFTypes32>::Read(cmELFInternalImpl<cmELFTypes32> *this,ELF_Dyn *x)

{
  basic_istream<char,_std::char_traits<char>_> *pbVar1;
  short sVar2;
  short sVar3;
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  long *plVar13;
  ELF_Dyn EVar14;
  undefined1 auVar15 [16];
  
  plVar13 = (long *)std::istream::read((char *)(this->super_cmELFInternal).Stream._M_t.
                                               super___uniq_ptr_impl<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
                                               .
                                               super__Head_base<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_false>
                                               ._M_head_impl,(long)x);
  if (((*(byte *)((long)plVar13 + *(long *)(*plVar13 + -0x18) + 0x20) & 5) == 0) &&
     ((this->super_cmELFInternal).NeedSwap == true)) {
    EVar14 = *x;
    auVar4._8_6_ = 0;
    auVar4._0_4_ = EVar14.d_tag;
    auVar4._4_4_ = EVar14.d_un;
    auVar4[0xe] = EVar14.d_un._3_1_;
    auVar5._8_4_ = 0;
    auVar5._0_4_ = EVar14.d_tag;
    auVar5._4_4_ = EVar14.d_un;
    auVar5[0xc] = EVar14.d_un._2_1_;
    auVar5._13_2_ = auVar4._13_2_;
    auVar6._8_4_ = 0;
    auVar6._0_4_ = EVar14.d_tag;
    auVar6._4_4_ = EVar14.d_un;
    auVar6._12_3_ = auVar5._12_3_;
    auVar7._8_2_ = 0;
    auVar7._0_4_ = EVar14.d_tag;
    auVar7._4_4_ = EVar14.d_un;
    auVar7[10] = EVar14.d_un._1_1_;
    auVar7._11_4_ = auVar6._11_4_;
    auVar8._8_2_ = 0;
    auVar8._0_4_ = EVar14.d_tag;
    auVar8._4_4_ = EVar14.d_un;
    auVar8._10_5_ = auVar7._10_5_;
    auVar9[8] = EVar14.d_un._0_1_;
    auVar9._0_4_ = EVar14.d_tag;
    auVar9._4_4_ = EVar14.d_un;
    auVar9._9_6_ = auVar8._9_6_;
    auVar10._7_8_ = 0;
    auVar10._0_7_ = auVar9._8_7_;
    auVar11._1_8_ = SUB158(auVar10 << 0x40,7);
    auVar11[0] = EVar14.d_tag._3_1_;
    auVar11._9_6_ = 0;
    auVar12._1_10_ = SUB1510(auVar11 << 0x30,5);
    auVar12[0] = EVar14.d_tag._2_1_;
    auVar12._11_4_ = 0;
    auVar15._3_12_ = SUB1512(auVar12 << 0x20,3);
    auVar15[2] = EVar14.d_tag._1_1_;
    auVar15[0] = (byte)EVar14.d_tag;
    auVar15[1] = 0;
    auVar15[0xf] = 0;
    auVar15 = pshuflw(auVar15,auVar15,0x1b);
    auVar15 = pshufhw(auVar15,auVar15,0x1b);
    sVar2 = auVar15._0_2_;
    sVar3 = auVar15._2_2_;
    EVar14.d_tag._1_1_ = (0 < sVar3) * (sVar3 < 0x100) * auVar15[2] - (0xff < sVar3);
    EVar14.d_tag._0_1_ = (0 < sVar2) * (sVar2 < 0x100) * auVar15[0] - (0xff < sVar2);
    sVar2 = auVar15._4_2_;
    EVar14.d_tag._2_1_ = (0 < sVar2) * (sVar2 < 0x100) * auVar15[4] - (0xff < sVar2);
    sVar2 = auVar15._6_2_;
    EVar14.d_tag._3_1_ = (0 < sVar2) * (sVar2 < 0x100) * auVar15[6] - (0xff < sVar2);
    sVar2 = auVar15._8_2_;
    EVar14.d_un.d_val._0_1_ = (0 < sVar2) * (sVar2 < 0x100) * auVar15[8] - (0xff < sVar2);
    sVar2 = auVar15._10_2_;
    EVar14.d_un.d_val._1_1_ = (0 < sVar2) * (sVar2 < 0x100) * auVar15[10] - (0xff < sVar2);
    sVar2 = auVar15._12_2_;
    EVar14.d_un.d_val._2_1_ = (0 < sVar2) * (sVar2 < 0x100) * auVar15[0xc] - (0xff < sVar2);
    sVar2 = auVar15._14_2_;
    EVar14.d_un.d_val._3_1_ = (0 < sVar2) * (sVar2 < 0x100) * auVar15[0xe] - (0xff < sVar2);
    *x = EVar14;
  }
  pbVar1 = (this->super_cmELFInternal).Stream._M_t.
           super___uniq_ptr_impl<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
           .super__Head_base<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_false>.
           _M_head_impl;
  return ((byte)pbVar1[*(long *)(*(long *)pbVar1 + -0x18) + 0x20] & 5) == 0;
}

Assistant:

bool Read(ELF_Dyn& x)
  {
    if (this->Stream->read(reinterpret_cast<char*>(&x), sizeof(x)) &&
        this->NeedSwap) {
      this->ByteSwap(x);
    }
    return !this->Stream->fail();
  }